

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_host_buffer.cpp
# Opt level: O0

void __thiscall gpu::shared_host_buffer::resize(shared_host_buffer *this,size_t size)

{
  uchar *puVar1;
  void *pvVar2;
  bad_alloc *this_00;
  allocator local_91;
  string local_90;
  allocator local_69;
  string local_68;
  Type local_34;
  undefined1 local_30 [4];
  Type type;
  Context context;
  size_t size_local;
  shared_host_buffer *this_local;
  
  if (size != this->size_) {
    context.data_ref_.super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)size;
    decref(this);
    puVar1 = (uchar *)operator_new__(8);
    this->buffer_ = puVar1;
    puVar1 = this->buffer_;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    incref(this);
    Context::Context((Context *)local_30);
    local_34 = Context::type((Context *)local_30);
    if (local_34 == TypeOpenCL) {
      pvVar2 = malloc((size_t)context.data_ref_.
                              super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi);
      this->data_ = pvVar2;
      if (this->data_ == (void *)0x0) {
        this_00 = (bad_alloc *)__cxa_allocate_exception(8);
        std::bad_alloc::bad_alloc(this_00);
        __cxa_throw(this_00,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_68,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/PolarNick239[P]ExternalSortingOnGPU/libs/gpu/libgpu/shared_host_buffer.cpp"
                 ,&local_69);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_90,"No GPU context!",&local_91);
      raiseException(&local_68,0x9e,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
      std::__cxx11::string::~string((string *)&local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
    }
    this->type_ = local_34;
    this->size_ = (size_t)context.data_ref_.
                          super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
    Context::~Context((Context *)local_30);
  }
  return;
}

Assistant:

void shared_host_buffer::resize(size_t size)
{
	if (size == size_)
		return;

	decref();

	buffer_	= new unsigned char [8];
	* (long long *) buffer_ = 0;
	incref();

	Context context;
	Context::Type type = context.type();

	switch (type) {
#ifdef CUDA_SUPPORT
	case Context::TypeCUDA:
		CUDA_SAFE_CALL( cudaMallocHost(&data_, size) );
		break;
#endif
	case Context::TypeOpenCL:
		// NOTTODO: implement pinned memory in opencl
		// currently we use a plain paged memory buffer
		data_ = malloc(size);
		if (!data_)
			throw std::bad_alloc();
		break;
	default:
		gpu::raiseException(__FILE__, __LINE__, "No GPU context!");
	}

	type_ = type;
	size_ = size;
}